

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  string *defaultComponent_local;
  cmInstallCommandArguments *this_local;
  
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::cmCommandArgumentsHelper(&this->Parser);
  cmCommandArgumentGroup::cmCommandArgumentGroup(&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Destination,&this->Parser,"DESTINATION",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Component,&this->Parser,"COMPONENT",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Rename,&this->Parser,"RENAME",&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Permissions,&this->Parser,"PERMISSIONS",&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Configurations,&this->Parser,"CONFIGURATIONS",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->Optional,&this->Parser,"OPTIONAL",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->NamelinkOnly,&this->Parser,"NAMELINK_ONLY",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->NamelinkSkip,&this->Parser,"NAMELINK_SKIP",&this->ArgumentGroup);
  std::__cxx11::string::string((string *)&this->DestinationString);
  std::__cxx11::string::string((string *)&this->PermissionsString);
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  std::__cxx11::string::string((string *)&this->DefaultComponentName,(string *)defaultComponent);
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
                                           const std::string& defaultComponent)
:Parser()
,ArgumentGroup()
,Destination   (&Parser, "DESTINATION"   , &ArgumentGroup)
,Component     (&Parser, "COMPONENT"     , &ArgumentGroup)
,Rename        (&Parser, "RENAME"        , &ArgumentGroup)
,Permissions   (&Parser, "PERMISSIONS"   , &ArgumentGroup)
,Configurations(&Parser, "CONFIGURATIONS", &ArgumentGroup)
,Optional      (&Parser, "OPTIONAL"      , &ArgumentGroup)
,NamelinkOnly  (&Parser, "NAMELINK_ONLY" , &ArgumentGroup)
,NamelinkSkip  (&Parser, "NAMELINK_SKIP" , &ArgumentGroup)
,GenericArguments(0)
,DefaultComponentName(defaultComponent)
{
}